

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O2

void Gia_ManMinCex(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  lit *begin;
  int iVar2;
  abctime aVar3;
  Abc_Cex_t *p_00;
  abctime aVar4;
  Gia_Man_t *pGia;
  sat_solver *psVar5;
  Vec_Int_t *p_01;
  uint uVar6;
  abctime time;
  abctime time_00;
  abctime time_01;
  abctime time_02;
  int iVar7;
  uint uVar8;
  int iLit;
  sat_solver *local_48;
  Gia_Man_t *local_40;
  Cnf_Dat_t *local_38;
  
  Abc_Clock();
  aVar3 = Abc_Clock();
  p_00 = Bmc_CexCareMinimizeAig(p,p->vCis->nSize - p->nRegs,pCex,1,1,1);
  uVar8 = 0;
  for (uVar6 = p_00->nRegs; (int)uVar6 < p_00->nBits; uVar6 = uVar6 + 1) {
    uVar8 = uVar8 + (((uint)(&p_00[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0);
  }
  Abc_CexFree(p_00);
  printf("Care bits = %d. ",(ulong)uVar8);
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x84c077,(char *)(aVar4 - aVar3),time);
  aVar3 = Abc_Clock();
  pGia = Gia_ManFramesForCexMin(p,pCex->iFrame + 1);
  local_38 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,0,0,0);
  uVar6 = pCex->iFrame;
  iVar7 = pCex->nPis;
  iVar1 = local_38->nVars;
  psVar5 = (sat_solver *)Cnf_DataWriteIntoSolver(local_38,1,0);
  iLit = 3;
  local_48 = psVar5;
  iVar2 = sat_solver_addclause(psVar5,&iLit,(lit *)&local_48);
  if (iVar2 != 0) {
    p_01 = Vec_IntAlloc((int)psVar5);
    for (uVar8 = pCex->nRegs; (int)uVar8 < pCex->nBits; uVar8 = uVar8 + 1) {
      iVar2 = Abc_Var2Lit((~uVar6 * iVar7 + iVar1 + uVar8) - pCex->nRegs,
                          (uint)(((uint)(&pCex[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) == 0)
                         );
      Vec_IntPush(p_01,iVar2);
    }
    local_40 = pGia;
    aVar4 = Abc_Clock();
    Abc_PrintTime(0x84c0e3,(char *)(aVar4 - aVar3),time_00);
    iVar7 = 0;
    do {
      if (iVar7 != 0) {
        if (iVar7 == 2) {
          free(p_01->pArray);
          free(p_01);
          sat_solver_delete(local_48);
          Cnf_DataFree(local_38);
          Gia_ManStop(local_40);
          return;
        }
        Vec_IntReverseOrder(p_01);
      }
      aVar3 = Abc_Clock();
      psVar5 = local_48;
      begin = p_01->pArray;
      iVar1 = p_01->nSize;
      uVar6 = sat_solver_solve(local_48,begin,begin + iVar1,0,0,0,0);
      printf("Status %d.  Selected %d assumptions out of %d.  ",(ulong)uVar6,
             (ulong)(uint)(psVar5->conf_final).size);
      aVar4 = Abc_Clock();
      Abc_PrintTime(0x84bfe4,(char *)(aVar4 - aVar3),time_01);
      aVar3 = Abc_Clock();
      uVar8 = sat_solver_minimize_assumptions(psVar5,begin,iVar1,0);
      printf("Status %d.  Selected %d assumptions out of %d.  ",(ulong)uVar6,(ulong)uVar8);
      aVar4 = Abc_Clock();
      Abc_PrintTime(0x84bff2,(char *)(aVar4 - aVar3),time_02);
      iVar7 = iVar7 + 1;
    } while( true );
  }
  __assert_fail("status",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                ,0x1d6,"void Gia_ManMinCex(Gia_Man_t *, Abc_Cex_t *)");
}

Assistant:

void Gia_ManMinCex( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    abctime clk = Abc_Clock();
    int n, i, iFirstVar, iLit, status, Counter = 0;//, Id;
    Vec_Int_t * vLits;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    int nFinal, * pFinal;
    Abc_Cex_t * pCexCare;
    Gia_Man_t * pFrames;

    // CEX minimization
    clk = Abc_Clock();
    pCexCare = Bmc_CexCareMinimizeAig( p, Gia_ManPiNum(p), pCex, 1, 1, 1 );
    for ( i = pCexCare->nRegs; i < pCexCare->nBits; i++ )
        Counter += Abc_InfoHasBit(pCexCare->pData, i);
    Abc_CexFree( pCexCare );
    printf( "Care bits = %d. ", Counter );
    Abc_PrintTime( 1, "CEX minimization", Abc_Clock() - clk );

    // SAT instance
    clk = Abc_Clock();
    pFrames = Gia_ManFramesForCexMin( p, pCex->iFrame + 1 );
    pCnf = (Cnf_Dat_t*)Mf_ManGenerateCnf( pFrames, 8, 0, 0, 0, 0 );
    iFirstVar = pCnf->nVars - (pCex->iFrame+1) * pCex->nPis;
    pSat = (sat_solver*)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    iLit = Abc_Var2Lit( 1, 1 );
    status = sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    assert( status );
    // create literals
    vLits = Vec_IntAlloc( 100 );
    for ( i = pCex->nRegs; i < pCex->nBits; i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(iFirstVar + i - pCex->nRegs, !Abc_InfoHasBit(pCex->pData, i)) );
    Abc_PrintTime( 1, "SAT solver", Abc_Clock() - clk );

    for ( n = 0; n < 2; n++ )
    {
        if ( n ) Vec_IntReverseOrder( vLits );

        // SAT-based minimization
        clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
        nFinal = sat_solver_final( pSat, &pFinal );
        printf( "Status %d.  Selected %d assumptions out of %d.  ", status, nFinal, Vec_IntSize(vLits) );
        Abc_PrintTime( 1, "Analyze_final", Abc_Clock() - clk );

        // SAT-based minimization
        clk = Abc_Clock();
        nFinal = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits), 0 );
        printf( "Status %d.  Selected %d assumptions out of %d.  ", status, nFinal, Vec_IntSize(vLits) );
        Abc_PrintTime( 1, "LEXUNSAT", Abc_Clock() - clk );
    }

    // cleanup
    Vec_IntFree( vLits );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pFrames );
}